

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O2

int av1_get_qindex(segmentation *seg,int segment_id,int base_qindex)

{
  uint uVar1;
  uint uVar2;
  
  if ((seg->enabled != '\0') && ((seg->feature_mask[segment_id & 0xff] & 1) != 0)) {
    uVar1 = seg->feature_data[segment_id][0] + base_qindex;
    uVar2 = 0xff;
    if (uVar1 < 0xff) {
      uVar2 = uVar1;
    }
    base_qindex = 0;
    if (-1 < (int)uVar1) {
      base_qindex = uVar2;
    }
  }
  return base_qindex;
}

Assistant:

int av1_get_qindex(const struct segmentation *seg, int segment_id,
                   int base_qindex) {
  if (segfeature_active(seg, segment_id, SEG_LVL_ALT_Q)) {
    const int data = get_segdata(seg, segment_id, SEG_LVL_ALT_Q);
    const int seg_qindex = base_qindex + data;
    return clamp(seg_qindex, 0, MAXQ);
  } else {
    return base_qindex;
  }
}